

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_bld.cpp
# Opt level: O2

UConverterSharedData * ucnv_load_63(UConverterLoadArgs *pArgs,UErrorCode *err)

{
  UHashtable *hash;
  uint16_t uVar1;
  UConverterSharedData *pUVar2;
  UConverterSharedData *value;
  UErrorCode local_1c;
  
  if ((err == (UErrorCode *)0x0) || (U_ZERO_ERROR < *err)) {
    pUVar2 = (UConverterSharedData *)0x0;
  }
  else {
    if ((pArgs->pkg != (char *)0x0) && (*pArgs->pkg != '\0')) {
      pUVar2 = createConverterFromFile(pArgs,err);
      return pUVar2;
    }
    if ((SHARED_DATA_HASHTABLE == (UHashtable *)0x0) ||
       (pUVar2 = (UConverterSharedData *)uhash_get_63(SHARED_DATA_HASHTABLE,pArgs->name),
       pUVar2 == (UConverterSharedData *)0x0)) {
      value = createConverterFromFile(pArgs,err);
      pUVar2 = (UConverterSharedData *)0x0;
      if ((value != (UConverterSharedData *)0x0) &&
         ((*err < U_ILLEGAL_ARGUMENT_ERROR && (pUVar2 = value, pArgs->onlyTestIsLoadable == '\0'))))
      {
        local_1c = U_ZERO_ERROR;
        if (SHARED_DATA_HASHTABLE == (UHashtable *)0x0) {
          uVar1 = ucnv_io_countKnownConverters_63(&local_1c);
          SHARED_DATA_HASHTABLE =
               uhash_openSize_63(uhash_hashChars_63,uhash_compareChars_63,(undefined1 *)0x0,
                                 (uint)uVar1 * 2,&local_1c);
          ucnv_enableCleanup_63();
          if (U_ZERO_ERROR < local_1c) {
            return value;
          }
        }
        hash = SHARED_DATA_HASHTABLE;
        value->sharedDataCached = '\x01';
        uhash_put_63(hash,value->staticData->name,value,&local_1c);
      }
    }
    else {
      pUVar2->referenceCounter = pUVar2->referenceCounter + 1;
    }
  }
  return pUVar2;
}

Assistant:

UConverterSharedData *
ucnv_load(UConverterLoadArgs *pArgs, UErrorCode *err) {
    UConverterSharedData *mySharedConverterData;

    if(err == NULL || U_FAILURE(*err)) {
        return NULL;
    }

    if(pArgs->pkg != NULL && *pArgs->pkg != 0) {
        /* application-provided converters are not currently cached */
        return createConverterFromFile(pArgs, err);
    }

    mySharedConverterData = ucnv_getSharedConverterData(pArgs->name);
    if (mySharedConverterData == NULL)
    {
        /*Not cached, we need to stream it in from file */
        mySharedConverterData = createConverterFromFile(pArgs, err);
        if (U_FAILURE (*err) || (mySharedConverterData == NULL))
        {
            return NULL;
        }
        else if (!pArgs->onlyTestIsLoadable)
        {
            /* share it with other library clients */
            ucnv_shareConverterData(mySharedConverterData);
        }
    }
    else
    {
        /* The data for this converter was already in the cache.            */
        /* Update the reference counter on the shared data: one more client */
        mySharedConverterData->referenceCounter++;
    }

    return mySharedConverterData;
}